

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_offset.c
# Opt level: O1

void container_add_offset_test(void **state_)

{
  container_t **loc;
  container_t **hic;
  container_t **hic_00;
  rle16_t **pprVar1;
  uint8_t type1;
  ushort offset;
  void *pvVar2;
  ushort *puVar3;
  unsigned_long a;
  array_container_t *paVar4;
  uint8_t uVar5;
  _Bool _Var6;
  int32_t iVar7;
  int iVar8;
  unsigned_long uVar9;
  ulong uVar10;
  uint uVar11;
  run_container_t *prVar12;
  container_t **loc_00;
  
  pvVar2 = *state_;
  puVar3 = *(ushort **)((long)pvVar2 + 8);
  a = *(unsigned_long *)((long)pvVar2 + 0x10);
  offset = *(ushort *)((long)pvVar2 + 0x18);
  type1 = *(uint8_t *)((long)pvVar2 + 0x1a);
  _assert_true((ulong)(a != 0),"test.n_values > 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
               ,0x6e);
  loc = (container_t **)((long)pvVar2 + 0x28);
  hic = (container_t **)((long)pvVar2 + 0x30);
  paVar4 = *(array_container_t **)((long)pvVar2 + 0x20);
  if (type1 == '\x03') {
    run_container_offset((run_container_t *)paVar4,loc,hic,offset);
  }
  else if (type1 == '\x02') {
    array_container_offset(paVar4,loc,hic,offset);
  }
  else {
    bitset_container_offset((bitset_container_t *)paVar4,loc,hic,offset);
  }
  paVar4 = *(array_container_t **)((long)pvVar2 + 0x20);
  hic_00 = (container_t **)((long)pvVar2 + 0x40);
  uVar11 = (uint)offset;
  if (type1 == '\x03') {
    run_container_offset((run_container_t *)paVar4,(container_t **)0x0,hic_00,offset);
  }
  else if (type1 == '\x02') {
    array_container_offset(paVar4,(container_t **)0x0,hic_00,offset);
  }
  else {
    bitset_container_offset((bitset_container_t *)paVar4,(container_t **)0x0,hic_00,offset);
  }
  paVar4 = *(array_container_t **)((long)pvVar2 + 0x20);
  loc_00 = (container_t **)((long)pvVar2 + 0x38);
  if (type1 == '\x03') {
    run_container_offset((run_container_t *)paVar4,loc_00,(container_t **)0x0,offset);
  }
  else if (type1 == '\x02') {
    array_container_offset(paVar4,loc_00,(container_t **)0x0,offset);
  }
  else {
    bitset_container_offset((bitset_container_t *)paVar4,loc_00,(container_t **)0x0,offset);
  }
  if (*puVar3 + uVar11 < 0x10000) {
    _assert_true((unsigned_long)*loc,"state->lo",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x78);
    _assert_true((unsigned_long)*loc_00,"state->lo_only",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x79);
    _Var6 = container_equals(*loc,type1,*loc_00,type1);
    _assert_true((ulong)_Var6,"container_equals(state->lo, type, state->lo_only, type)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x7a);
    prVar12 = (run_container_t *)*loc;
    uVar5 = type1;
    if (type1 == '\x04') {
      pprVar1 = &prVar12->runs;
      prVar12 = *(run_container_t **)prVar12;
      uVar5 = *(uint8_t *)pprVar1;
    }
    if (uVar5 == '\x03') {
      iVar7 = run_container_cardinality(prVar12);
    }
    else if (uVar5 == '\x02') {
      iVar7 = prVar12->n_runs;
    }
    else {
      iVar7 = prVar12->n_runs;
    }
  }
  else {
    _assert_true((ulong)(*loc == (container_t *)0x0),"state->lo",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x75);
    _assert_true((ulong)(*loc_00 == (container_t *)0x0),"state->lo_only",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x76);
    iVar7 = 0;
  }
  if (puVar3[a - 1] + uVar11 < 0x10000) {
    _assert_true((ulong)(*hic == (container_t *)0x0),"state->hi",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x7e);
    _assert_true((ulong)(*hic_00 == (container_t *)0x0),"state->hi_only",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x7f);
    iVar8 = 0;
  }
  else {
    _assert_true((unsigned_long)*hic,"state->hi",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x81);
    _assert_true((unsigned_long)*hic_00,"state->hi_only",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x82);
    _Var6 = container_equals(*hic,type1,*hic_00,type1);
    _assert_true((ulong)_Var6,"container_equals(state->hi, type, state->hi_only, type)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x83);
    prVar12 = (run_container_t *)*hic;
    uVar5 = type1;
    if (type1 == '\x04') {
      uVar5 = *(uint8_t *)&prVar12->runs;
      prVar12 = *(run_container_t **)prVar12;
    }
    if (uVar5 == '\x03') {
      iVar8 = run_container_cardinality(prVar12);
    }
    else {
      iVar8 = prVar12->n_runs;
    }
  }
  _assert_int_equal(a,(long)(iVar8 + iVar7),
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                    ,0x87);
  if (a == 0) {
    uVar10 = 0;
  }
  else {
    uVar9 = 0;
    do {
      uVar10 = uVar9;
      if (0xffff < puVar3[uVar9] + uVar11) break;
      _Var6 = container_contains(*loc,(uint16_t)(puVar3[uVar9] + uVar11),type1);
      _assert_true((ulong)_Var6,"container_contains(state->lo, offset + test.values[i], type)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                   ,0x8d);
      uVar9 = uVar9 + 1;
      uVar10 = a;
    } while (a != uVar9);
  }
  if (uVar10 < a) {
    do {
      _Var6 = container_contains(*hic,puVar3[uVar10] + offset,type1);
      _assert_true((ulong)_Var6,"container_contains(state->hi, offset + test.values[i], type)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                   ,0x91);
      uVar10 = uVar10 + 1;
    } while (a != uVar10);
  }
  return;
}

Assistant:

static void container_add_offset_test(void **state_) {
    container_add_offset_test_state_t *state =
        *(container_add_offset_test_state_t **)state_;
    container_add_offset_test_case_t test = state->test_case;
    uint16_t offset = test.offset;
    uint8_t type = test.type;
    int card_lo = 0, card_hi = 0;

    assert_true(test.n_values > 0);

    container_add_offset(state->in, type, &state->lo, &state->hi, offset);
    container_add_offset(state->in, type, NULL, &state->hi_only, offset);
    container_add_offset(state->in, type, &state->lo_only, NULL, offset);

    if ((int)offset + test.values[0] > UINT16_MAX) {
        assert_null(state->lo);
        assert_null(state->lo_only);
    } else {
        assert_non_null(state->lo);
        assert_non_null(state->lo_only);
        assert_true(container_equals(state->lo, type, state->lo_only, type));
        card_lo = container_get_cardinality(state->lo, type);
    }
    if ((int)offset + test.values[test.n_values - 1] <= UINT16_MAX) {
        assert_null(state->hi);
        assert_null(state->hi_only);
    } else {
        assert_non_null(state->hi);
        assert_non_null(state->hi_only);
        assert_true(container_equals(state->hi, type, state->hi_only, type));
        card_hi = container_get_cardinality(state->hi, type);
    }

    assert_int_equal(test.n_values, card_lo + card_hi);

    size_t i = 0;
    for (; i < test.n_values && (int)offset + test.values[i] <= UINT16_MAX;
         i++) {
        assert_true(
            container_contains(state->lo, offset + test.values[i], type));
    }
    for (; i < test.n_values; i++) {
        assert_true(
            container_contains(state->hi, offset + test.values[i], type));
    }
}